

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPolarDecomposition.cpp
# Opt level: O2

double chrono::fea::PolarDecomposition::Compute(double *M,double *Q,double *S,double tolerance)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int i_1;
  double *pdVar3;
  int i;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  long lVar7;
  int k;
  undefined1 auVar9 [16];
  long lVar8;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double Mk [9];
  undefined1 local_c8 [64];
  undefined8 local_88;
  double Ek [9];
  undefined1 extraout_var [56];
  
  pdVar3 = Mk;
  pdVar5 = M;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    pdVar6 = pdVar5;
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      dVar17 = *pdVar6;
      pdVar6 = pdVar6 + 3;
      pdVar3[lVar7] = dVar17;
    }
    pdVar5 = pdVar5 + 1;
    pdVar3 = pdVar3 + 3;
  }
  pdVar3 = Mk;
  dVar17 = oneNorm(pdVar3);
  dVar18 = infNorm(pdVar3);
  while( true ) {
    auVar14._8_8_ = Mk[2];
    auVar14._0_8_ = Mk[1];
    auVar14._16_8_ = Mk[3];
    auVar14._24_8_ = Mk[4];
    auVar14._32_8_ = Mk[5];
    auVar14._40_8_ = Mk[6];
    auVar14._48_8_ = Mk[7];
    auVar14._56_8_ = Mk[8];
    auVar9._8_8_ = 0;
    auVar9._0_8_ = Mk[0];
    auVar10 = vbroadcastsd_avx512f(auVar9);
    auVar11 = vpermpd_avx512f(_DAT_00e8eb40,auVar14);
    auVar12 = vpermpd_avx512f(_DAT_00e8eb00,auVar14);
    auVar32._8_8_ = Mk[2];
    auVar32._0_8_ = auVar10._0_8_;
    auVar13 = vinsertf32x4_avx512f(auVar14,auVar32,0);
    auVar14 = vpermpd_avx512f(_DAT_00e8eb80,auVar14);
    auVar16._40_8_ = auVar10._40_8_;
    auVar15._0_48_ = auVar11._0_48_;
    auVar15._48_8_ = auVar10._48_8_;
    auVar15._56_8_ = auVar11._56_8_;
    auVar11 = vmulpd_avx512f(auVar15,auVar13);
    auVar16._0_40_ = auVar14._0_40_;
    auVar16._48_8_ = auVar14._48_8_;
    auVar16._56_8_ = auVar14._56_8_;
    auVar14 = vfmsub213pd_avx512f(auVar16,auVar12,auVar11);
    local_c8 = vpermpd_avx512f(_DAT_00e8ebc0,auVar14);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = Mk[4];
    auVar28._8_8_ = 0;
    auVar28._0_8_ = Mk[1] * Mk[3];
    auVar9 = vfmsub231sd_fma(auVar28,auVar10._0_16_,auVar23);
    local_88 = auVar9._0_8_;
    auVar9 = vextractf32x4_avx512f(auVar14,2);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = auVar14._16_8_ * Mk[1];
    auVar23 = vfmadd213sd_fma(auVar9,auVar10._0_16_,auVar30);
    auVar9 = vshufpd_avx(auVar14._16_16_,auVar14._16_16_,1);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = Mk[2];
    auVar9 = vfmadd132sd_fma(auVar9,auVar23,auVar1);
    dVar19 = auVar9._0_8_;
    if ((dVar19 == 0.0) && (!NAN(dVar19))) break;
    dVar20 = oneNorm((double *)local_c8);
    dVar21 = infNorm((double *)local_c8);
    auVar22._0_8_ = (dVar21 * dVar20) / (dVar18 * dVar17);
    auVar22._8_8_ = 0;
    if (auVar22._0_8_ < 0.0) {
      auVar10._0_8_ = sqrt(auVar22._0_8_);
      auVar10._8_56_ = extraout_var;
      auVar23 = auVar10._0_16_;
    }
    else {
      auVar23 = vsqrtsd_avx(auVar22,auVar22);
    }
    auVar25._8_8_ = 0x7fffffffffffffff;
    auVar25._0_8_ = 0x7fffffffffffffff;
    auVar9 = vandpd_avx(auVar25,auVar9);
    auVar24._0_8_ = auVar23._0_8_ / auVar9._0_8_;
    auVar24._8_8_ = auVar23._8_8_;
    if (auVar24._0_8_ < 0.0) {
      dVar17 = sqrt(auVar24._0_8_);
    }
    else {
      auVar9 = vsqrtsd_avx(auVar24,auVar24);
      dVar17 = auVar9._0_8_;
    }
    for (lVar4 = 0; lVar4 != 9; lVar4 = lVar4 + 1) {
      dVar18 = Mk[lVar4];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = dVar18;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar17 * 0.5;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = (0.5 / (dVar17 * dVar19)) * *(double *)(local_c8 + lVar4 * 8);
      auVar9 = vfmadd231sd_fma(auVar31,auVar26,auVar29);
      Mk[lVar4] = auVar9._0_8_;
      Ek[lVar4] = dVar18 - auVar9._0_8_;
    }
    dVar20 = oneNorm(Ek);
    dVar17 = oneNorm(pdVar3);
    dVar18 = infNorm(pdVar3);
    if (((dVar19 == 0.0) && (!NAN(dVar19))) || (dVar20 <= dVar17 * tolerance)) goto LAB_00b4cb6a;
  }
  puts("Warning (polarDecomposition) : zero determinant encountered.");
LAB_00b4cb6a:
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    pdVar5 = pdVar3;
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      dVar17 = *pdVar5;
      pdVar5 = pdVar5 + 3;
      Q[lVar7] = dVar17;
    }
    Q = Q + 3;
    pdVar3 = pdVar3 + 1;
  }
  pdVar3 = Mk;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    pdVar5 = M;
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      S[lVar4 * 3 + lVar7] = 0.0;
      auVar9 = ZEXT816(0) << 0x40;
      lVar8 = 0;
      pdVar6 = pdVar5;
      while (lVar8 != 3) {
        auVar27._8_8_ = 0;
        auVar27._0_8_ = pdVar3[lVar8];
        lVar8 = lVar8 + 1;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *pdVar6;
        auVar9 = vfmadd231sd_fma(auVar9,auVar27,auVar2);
        pdVar6 = pdVar6 + 3;
        S[lVar4 * 3 + lVar7] = auVar9._0_8_;
      }
      pdVar5 = pdVar5 + 1;
    }
    pdVar3 = pdVar3 + 3;
  }
  lVar4 = 0x48;
  for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
    pdVar3 = S;
    for (lVar8 = 0; lVar4 != lVar8; lVar8 = lVar8 + 0x18) {
      dVar17 = (*pdVar3 + *(double *)((long)S + lVar8)) * 0.5;
      *(double *)((long)S + lVar8) = dVar17;
      *pdVar3 = dVar17;
      pdVar3 = pdVar3 + 1;
    }
    S = S + 4;
    lVar4 = lVar4 + -0x18;
  }
  return dVar19;
}

Assistant:

double PolarDecomposition::Compute(const double* M, double* Q, double* S, double tolerance) {
    double Mk[9];
    double Ek[9];
    double det, M_oneNorm, M_infNorm, E_oneNorm;

    // Mk = M^T
    for (int i = 0; i < 3; i++)
        for (int j = 0; j < 3; j++)
            Mk[3 * i + j] = M[3 * j + i];

    M_oneNorm = oneNorm(Mk);
    M_infNorm = infNorm(Mk);

    do {
        double MadjTk[9];

        // row 2 x row 3
        crossProduct(&(Mk[3]), &(Mk[6]), &(MadjTk[0]));
        // row 3 x row 1
        crossProduct(&(Mk[6]), &(Mk[0]), &(MadjTk[3]));
        // row 1 x row 2
        crossProduct(&(Mk[0]), &(Mk[3]), &(MadjTk[6]));

        det = Mk[0] * MadjTk[0] + Mk[1] * MadjTk[1] + Mk[2] * MadjTk[2];
        if (det == 0.0) {
            printf("Warning (polarDecomposition) : zero determinant encountered.\n");
            break;
        }

        double MadjT_one = oneNorm(MadjTk);
        double MadjT_inf = infNorm(MadjTk);

        double gamma = sqrt(sqrt((MadjT_one * MadjT_inf) / (M_oneNorm * M_infNorm)) / fabs(det));
        double g1 = gamma * 0.5;
        double g2 = 0.5 / (gamma * det);

        for (int i = 0; i < 9; i++) {
            Ek[i] = Mk[i];
            Mk[i] = g1 * Mk[i] + g2 * MadjTk[i];
            Ek[i] -= Mk[i];
        }

        E_oneNorm = oneNorm(Ek);
        M_oneNorm = oneNorm(Mk);
        M_infNorm = infNorm(Mk);
    } while (E_oneNorm > M_oneNorm * tolerance);

    // Q = Mk^T
    for (int i = 0; i < 3; i++)
        for (int j = 0; j < 3; j++)
            Q[3 * i + j] = Mk[3 * j + i];

    for (int i = 0; i < 3; i++)
        for (int j = 0; j < 3; j++) {
            S[3 * i + j] = 0;
            for (int k = 0; k < 3; k++)
                S[3 * i + j] += Mk[3 * i + k] * M[3 * k + j];
        }

    // S must be symmetric; enforce the symmetry
    for (int i = 0; i < 3; i++)
        for (int j = i; j < 3; j++)
            S[3 * i + j] = S[3 * j + i] = 0.5 * (S[3 * i + j] + S[3 * j + i]);

    return (det);
}